

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O3

void __thiscall embree::TutorialApplication::initRayStats(TutorialApplication *this)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  if (g_stats == (RayStats *)0x0) {
    iVar1 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    g_stats = (RayStats *)alignedMalloc((long)iVar1 << 7,0x40);
  }
  iVar1 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  if (iVar1 != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      *(undefined4 *)((long)g_stats->pad + lVar2 + -4) = 0;
      uVar3 = uVar3 + 1;
      iVar1 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
      lVar2 = lVar2 + 0x80;
    } while (uVar3 < (ulong)(long)iVar1);
  }
  return;
}

Assistant:

void TutorialApplication::initRayStats()
  {
    if (!g_stats)
      g_stats = (RayStats*)alignedMalloc(TaskScheduler::threadCount() * sizeof(RayStats), 64);

    for (size_t i = 0; i < TaskScheduler::threadCount(); i++)
      g_stats[i].numRays = 0;
  }